

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O2

void __thiscall
benchmark::internal::BenchmarkImp::DenseRange(BenchmarkImp *this,int start,int limit,int step)

{
  int iVar1;
  char *check;
  initializer_list<int> __l;
  allocator_type local_4d;
  int local_4c;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  iVar1 = ArgsCnt(this);
  if (iVar1 != -1) {
    iVar1 = ArgsCnt(this);
    if (iVar1 != 1) {
      check = "ArgsCnt() == -1 || ArgsCnt() == 1";
      iVar1 = 0x217;
      goto LAB_001249ef;
    }
  }
  GetNullLogInstance();
  if (start < 0) {
    check = "(start) >= (0)";
    iVar1 = 0x218;
  }
  else {
    GetNullLogInstance();
    if (start <= limit) {
      GetNullLogInstance();
      for (; start <= limit; start = start + step) {
        __l._M_len = 1;
        __l._M_array = &local_4c;
        local_4c = start;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_48,__l,&local_4d);
        std::
        vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
        ::emplace_back<std::vector<int,std::allocator<int>>>
                  ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                    *)&this->args_,(vector<int,_std::allocator<int>_> *)&local_48);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
      }
      return;
    }
    check = "(start) <= (limit)";
    iVar1 = 0x219;
  }
LAB_001249ef:
  CheckHandler::CheckHandler
            ((CheckHandler *)&local_48,check,
             "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
             ,"DenseRange",iVar1);
  CheckHandler::~CheckHandler((CheckHandler *)&local_48);
}

Assistant:

void BenchmarkImp::DenseRange(int start, int limit, int step) {
  CHECK(ArgsCnt() == -1 || ArgsCnt() == 1);
  CHECK_GE(start, 0);
  CHECK_LE(start, limit);
  for (int arg = start; arg <= limit; arg+= step) {
    args_.push_back({arg});
  }
}